

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDARcheck1(IDAMem IDA_mem)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  double dVar3;
  int zroot;
  sunrealtype tplus;
  sunrealtype hratio;
  sunrealtype smallh;
  int retval;
  int i;
  double local_40;
  int local_14;
  int local_4;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x440) + (long)local_14 * 4) = 0;
  }
  *(undefined8 *)(in_RDI + 0x450) = *(undefined8 *)(in_RDI + 0x2a8);
  *(double *)(in_RDI + 0x488) =
       (ABS(*(double *)(in_RDI + 0x2a8)) + ABS(*(double *)(in_RDI + 0x290))) *
       *(double *)(in_RDI + 8) * 100.0;
  iVar2 = (**(code **)(in_RDI + 0x430))
                    (*(undefined8 *)(in_RDI + 0x450),*(undefined8 *)(in_RDI + 0x60),
                     *(undefined8 *)(in_RDI + 0x68),*(undefined8 *)(in_RDI + 0x468),
                     *(undefined8 *)(in_RDI + 0x18));
  *(undefined8 *)(in_RDI + 0x498) = 1;
  if (iVar2 == 0) {
    bVar1 = false;
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
      dVar3 = ABS(*(double *)(*(long *)(in_RDI + 0x468) + (long)local_14 * 8));
      if ((dVar3 == 0.0) && (!NAN(dVar3))) {
        bVar1 = true;
        *(undefined4 *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) = 0;
      }
    }
    if (bVar1) {
      if (*(double *)(in_RDI + 0x488) / ABS(*(double *)(in_RDI + 0x290)) <= 0.1) {
        local_40 = 0.1;
      }
      else {
        local_40 = *(double *)(in_RDI + 0x488) / ABS(*(double *)(in_RDI + 0x290));
      }
      local_40 = local_40 * *(double *)(in_RDI + 0x290);
      dVar3 = *(double *)(in_RDI + 0x450);
      N_VLinearSum(0x3ff0000000000000,local_40,*(undefined8 *)(in_RDI + 0x60),
                   *(undefined8 *)(in_RDI + 0x68),*(undefined8 *)(in_RDI + 0x188));
      iVar2 = (**(code **)(in_RDI + 0x430))
                        (dVar3 + local_40,*(undefined8 *)(in_RDI + 0x188),
                         *(undefined8 *)(in_RDI + 0x68),*(undefined8 *)(in_RDI + 0x470),
                         *(undefined8 *)(in_RDI + 0x18));
      *(long *)(in_RDI + 0x498) = *(long *)(in_RDI + 0x498) + 1;
      if (iVar2 == 0) {
        for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x438); local_14 = local_14 + 1) {
          if ((*(int *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) == 0) &&
             ((dVar3 = ABS(*(double *)(*(long *)(in_RDI + 0x470) + (long)local_14 * 8)),
              dVar3 != 0.0 || (NAN(dVar3))))) {
            *(undefined4 *)(*(long *)(in_RDI + 0x4a0) + (long)local_14 * 4) = 1;
            *(undefined8 *)(*(long *)(in_RDI + 0x468) + (long)local_14 * 8) =
                 *(undefined8 *)(*(long *)(in_RDI + 0x470) + (long)local_14 * 8);
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = -10;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = -10;
  }
  return local_4;
}

Assistant:

static int IDARcheck1(IDAMem IDA_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  for (i = 0; i < IDA_mem->ida_nrtfn; i++) { IDA_mem->ida_iroots[i] = 0; }
  IDA_mem->ida_tlo  = IDA_mem->ida_tn;
  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);

  /* Evaluate g at initial t and check for zero values. */
  retval           = IDA_mem->ida_gfun(IDA_mem->ida_tlo, IDA_mem->ida_phi[0],
                                       IDA_mem->ida_phi[1], IDA_mem->ida_glo,
                                       IDA_mem->ida_user_data);
  IDA_mem->ida_nge = 1;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (SUNRabs(IDA_mem->ida_glo[i]) == ZERO)
    {
      zroot                   = SUNTRUE;
      IDA_mem->ida_gactive[i] = SUNFALSE;
    }
  }
  if (!zroot) { return (IDA_SUCCESS); }

  /* Some g_i is zero at t0; look at g at t0+(small increment). */
  hratio = SUNMAX(IDA_mem->ida_ttol / SUNRabs(IDA_mem->ida_hh), PT1);
  smallh = hratio * IDA_mem->ida_hh;
  tplus  = IDA_mem->ida_tlo + smallh;
  N_VLinearSum(ONE, IDA_mem->ida_phi[0], smallh, IDA_mem->ida_phi[1],
               IDA_mem->ida_yy);
  retval = IDA_mem->ida_gfun(tplus, IDA_mem->ida_yy, IDA_mem->ida_phi[1],
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  /* We check now only the components of g which were exactly 0.0 at t0
   * to see if we can 'activate' them. */
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && SUNRabs(IDA_mem->ida_ghi[i]) != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
      IDA_mem->ida_glo[i]     = IDA_mem->ida_ghi[i];
    }
  }
  return (IDA_SUCCESS);
}